

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O0

State * __thiscall despot::Adventurer::CreateStartState(Adventurer *this,string *type)

{
  const_reference pvVar1;
  State *this_00;
  double dVar2;
  AdventurerState *state;
  double sum;
  int goal;
  double prob;
  string *type_local;
  Adventurer *this_local;
  
  dVar2 = (double)despot::Random::NextDouble();
  state = (AdventurerState *)0x0;
  for (sum._4_4_ = 0; sum._4_4_ < this->num_goals_; sum._4_4_ = sum._4_4_ + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->goal_prob_,(long)sum._4_4_);
    state = (AdventurerState *)(*pvVar1 + (double)state);
    if (dVar2 <= (double)state) break;
  }
  this_00 = (State *)operator_new(0x20);
  AdventurerState::AdventurerState((AdventurerState *)this_00,sum._4_4_ * this->size_);
  return this_00;
}

Assistant:

State* Adventurer::CreateStartState(string type) const {
	double prob = Random::RANDOM.NextDouble();
	int goal = 0;
	double sum = 0;
	for (; goal < num_goals_; goal++) {
		sum += goal_prob_[goal];
		if (sum >= prob)
			break;
	}
	AdventurerState* state = new AdventurerState(goal * size_);
	return state;
}